

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleSerialAnalyzer::SetupResults(SimpleSerialAnalyzer *this)

{
  SimpleSerialAnalyzerResults *this_00;
  pointer pSVar1;
  SimpleSerialAnalyzer *this_local;
  
  this_00 = (SimpleSerialAnalyzerResults *)operator_new(0x20);
  SimpleSerialAnalyzerResults::SimpleSerialAnalyzerResults(this_00,this,&this->mSettings);
  std::unique_ptr<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>::
  reset(&this->mResults,this_00);
  std::unique_ptr<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>::
  get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  pSVar1 = std::
           unique_ptr<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
           ::operator->(&this->mResults);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)pSVar1);
  return;
}

Assistant:

void SimpleSerialAnalyzer::SetupResults()
{
	// SetupResults is called each time the analyzer is run. Because the same instance can be used for multiple runs, we need to clear the results each time.
	mResults.reset(new SimpleSerialAnalyzerResults( this, &mSettings ));
	SetAnalyzerResults( mResults.get() );
	mResults->AddChannelBubblesWillAppearOn( mSettings.mInputChannel );
}